

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::base::utils::Str::replaceFirstWithEscape
               (string_t *str,string_t *replaceWhat,string_t *replaceWith)

{
  char *pcVar1;
  string *psVar2;
  ulong in_RSI;
  string *in_RDI;
  size_t foundAt;
  ulong local_30;
  
  while( true ) {
    local_30 = ::std::__cxx11::string::find(in_RDI,in_RSI);
    if (local_30 == 0xffffffffffffffff) {
      return;
    }
    if ((local_30 == 0) ||
       (pcVar1 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar1 != '%')) break;
    if (local_30 == 0) {
      local_30 = 0;
    }
    else {
      local_30 = local_30 - 1;
    }
    ::std::__cxx11::string::erase((ulong)in_RDI,local_30);
  }
  psVar2 = (string *)::std::__cxx11::string::length();
  ::std::__cxx11::string::replace((ulong)in_RDI,local_30,psVar2);
  return;
}

Assistant:

void Str::replaceFirstWithEscape(base::type::string_t& str, const base::type::string_t& replaceWhat,
                                 const base::type::string_t& replaceWith) {
  std::size_t foundAt = base::type::string_t::npos;
  while ((foundAt = str.find(replaceWhat, foundAt + 1)) != base::type::string_t::npos) {
    if (foundAt > 0 && str[foundAt - 1] == base::consts::kFormatSpecifierChar) {
      str.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
      ++foundAt;
    } else {
      str.replace(foundAt, replaceWhat.length(), replaceWith);
      return;
    }
  }
}